

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O1

void Pdr_ManSetPropertyOutput(Pdr_Man_t *p,int k)

{
  sat_solver *s;
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  undefined8 in_RAX;
  Aig_Man_t *pAVar4;
  long lVar5;
  int Lit;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (-1 < k) {
    if (k < p->vSolvers->nSize) {
      s = (sat_solver *)p->vSolvers->pArray[(uint)k];
      pAVar4 = p->pAig;
      if (0 < pAVar4->nTruePos) {
        lVar5 = 0;
        do {
          if (pAVar4->vCos->nSize <= lVar5) goto LAB_0054ef91;
          pVVar1 = p->vCexes;
          if (pVVar1 == (Vec_Ptr_t *)0x0) {
LAB_0054ef13:
            pVVar2 = p->pPars->vOutMap;
            if (pVVar2 != (Vec_Int_t *)0x0) {
              if (pVVar2->nSize <= lVar5) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (pVVar2->pArray[lVar5] == -1) goto LAB_0054ef66;
            }
            iVar3 = Pdr_ObjSatVar(p,k,1,(Aig_Obj_t *)pAVar4->vCos->pArray[lVar5]);
            uStack_38 = CONCAT44(iVar3 * 2 + 1,(undefined4)uStack_38);
            iVar3 = sat_solver_addclause
                              (s,(lit *)((long)&uStack_38 + 4),(lit *)&stack0xffffffffffffffd0);
            if (iVar3 != 1) {
              __assert_fail("RetValue == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                            ,0xc1,"void Pdr_ManSetPropertyOutput(Pdr_Man_t *, int)");
            }
          }
          else {
            if (pVVar1->nSize <= lVar5) goto LAB_0054ef91;
            if (pVVar1->pArray[lVar5] == (void *)0x0) goto LAB_0054ef13;
          }
LAB_0054ef66:
          lVar5 = lVar5 + 1;
          pAVar4 = p->pAig;
        } while (lVar5 < pAVar4->nTruePos);
      }
      sat_solver_compress(s);
      return;
    }
  }
LAB_0054ef91:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Pdr_ManSetPropertyOutput( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int Lit, RetValue, i;
    pSat = Pdr_ManSolver(p, k);
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        // skip solved outputs
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        // skip timedout outputs
        if ( p->pPars->vOutMap && Vec_IntEntry(p->pPars->vOutMap, i) == -1 )
            continue;
        Lit = toLitCond( Pdr_ObjSatVar(p, k, 1, pObj), 1 ); // neg literal
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
    }
    sat_solver_compress( pSat );
}